

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void transpose_pq_14_inv_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,__m128i *x6,
               __m128i *x7,__m128i *pq0,__m128i *pq1,__m128i *pq2,__m128i *pq3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  __m128i w1;
  __m128i w0;
  __m128i w13;
  __m128i w12;
  __m128i w11;
  __m128i w10;
  undefined1 uStack_244;
  undefined1 uStack_243;
  undefined1 uStack_242;
  undefined1 uStack_241;
  undefined1 uStack_234;
  undefined1 uStack_233;
  undefined1 uStack_232;
  undefined1 uStack_231;
  undefined1 uStack_224;
  undefined1 uStack_223;
  undefined1 uStack_222;
  undefined1 uStack_221;
  undefined1 uStack_214;
  undefined1 uStack_213;
  undefined1 uStack_212;
  undefined1 uStack_211;
  undefined1 uStack_204;
  undefined1 uStack_203;
  undefined1 uStack_202;
  undefined1 uStack_201;
  undefined1 uStack_1f4;
  undefined1 uStack_1f3;
  undefined1 uStack_1f2;
  undefined1 uStack_1f1;
  undefined1 uStack_1e4;
  undefined1 uStack_1e3;
  undefined1 uStack_1e2;
  undefined1 uStack_1e1;
  undefined1 uStack_1d4;
  undefined1 uStack_1d3;
  undefined1 uStack_1d2;
  undefined1 uStack_1d1;
  undefined1 local_1c8;
  undefined1 uStack_1c7;
  undefined1 uStack_1c6;
  undefined1 uStack_1c5;
  undefined1 local_1b8;
  undefined1 uStack_1b7;
  undefined1 uStack_1b6;
  undefined1 uStack_1b5;
  undefined1 local_1a8;
  undefined1 uStack_1a7;
  undefined1 uStack_1a6;
  undefined1 uStack_1a5;
  undefined1 local_198;
  undefined1 uStack_197;
  undefined1 uStack_196;
  undefined1 uStack_195;
  undefined1 local_188;
  undefined1 uStack_187;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined1 local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  undefined1 local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  undefined1 local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i w5;
  __m128i w4;
  __m128i w3;
  __m128i w2;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_158 = (undefined1)uVar1;
  uStack_157 = (undefined1)((ulong)uVar1 >> 8);
  uStack_156 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_155 = (undefined1)((ulong)uVar1 >> 0x18);
  local_168 = (undefined1)uVar2;
  uStack_167 = (undefined1)((ulong)uVar2 >> 8);
  uStack_166 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_165 = (undefined1)((ulong)uVar2 >> 0x18);
  uVar1 = *in_RDX;
  uVar2 = *in_RCX;
  local_178 = (undefined1)uVar1;
  uStack_177 = (undefined1)((ulong)uVar1 >> 8);
  uStack_176 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_175 = (undefined1)((ulong)uVar1 >> 0x18);
  local_188 = (undefined1)uVar2;
  uStack_187 = (undefined1)((ulong)uVar2 >> 8);
  uStack_186 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_185 = (undefined1)((ulong)uVar2 >> 0x18);
  uVar1 = *in_R8;
  uVar2 = *in_R9;
  local_198 = (undefined1)uVar1;
  uStack_197 = (undefined1)((ulong)uVar1 >> 8);
  uStack_196 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_195 = (undefined1)((ulong)uVar1 >> 0x18);
  local_1a8 = (undefined1)uVar2;
  uStack_1a7 = (undefined1)((ulong)uVar2 >> 8);
  uStack_1a6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_1a5 = (undefined1)((ulong)uVar2 >> 0x18);
  uVar1 = *(undefined8 *)w1[1];
  uVar2 = *(undefined8 *)w0[0];
  local_1b8 = (undefined1)uVar1;
  uStack_1b7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_1b6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_1b5 = (undefined1)((ulong)uVar1 >> 0x18);
  local_1c8 = (undefined1)uVar2;
  uStack_1c7 = (undefined1)((ulong)uVar2 >> 8);
  uStack_1c6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_1c5 = (undefined1)((ulong)uVar2 >> 0x18);
  uVar1 = *(undefined8 *)w0[0];
  uVar2 = *(undefined8 *)w1[1];
  uStack_1d4 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_1d3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_1d2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_1d1 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_1e4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_1e3 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_1e2 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_1e1 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = *in_R9;
  uVar2 = *in_R8;
  uStack_1f4 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_1f3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_1f2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_1f1 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_204 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_203 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_202 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_201 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = *in_RCX;
  uVar2 = *in_RDX;
  uStack_214 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_213 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_212 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_211 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_224 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_223 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_222 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_221 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = *in_RSI;
  uVar2 = *in_RDI;
  uStack_234 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_233 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_232 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_231 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_244 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_243 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_242 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_241 = (undefined1)((ulong)uVar2 >> 0x38);
  *(undefined1 *)w0[1] = local_158;
  *(undefined1 *)(w0[1] + 1) = local_168;
  *(undefined1 *)(w0[1] + 2) = local_178;
  *(undefined1 *)(w0[1] + 3) = local_188;
  *(undefined1 *)(w0[1] + 4) = local_198;
  *(undefined1 *)(w0[1] + 5) = local_1a8;
  *(undefined1 *)(w0[1] + 6) = local_1b8;
  *(undefined1 *)(w0[1] + 7) = local_1c8;
  *(undefined1 *)(w0[1] + 8) = uStack_1d4;
  *(undefined1 *)(w0[1] + 9) = uStack_1e4;
  *(undefined1 *)(w0[1] + 10) = uStack_1f4;
  *(undefined1 *)(w0[1] + 0xb) = uStack_204;
  *(undefined1 *)(w0[1] + 0xc) = uStack_214;
  *(undefined1 *)(w0[1] + 0xd) = uStack_224;
  *(undefined1 *)(w0[1] + 0xe) = uStack_234;
  *(undefined1 *)(w0[1] + 0xf) = uStack_244;
  *(undefined1 *)w13[0] = uStack_157;
  *(undefined1 *)(w13[0] + 1) = uStack_167;
  *(undefined1 *)(w13[0] + 2) = uStack_177;
  *(undefined1 *)(w13[0] + 3) = uStack_187;
  *(undefined1 *)(w13[0] + 4) = uStack_197;
  *(undefined1 *)(w13[0] + 5) = uStack_1a7;
  *(undefined1 *)(w13[0] + 6) = uStack_1b7;
  *(undefined1 *)(w13[0] + 7) = uStack_1c7;
  *(undefined1 *)(w13[0] + 8) = uStack_1d3;
  *(undefined1 *)(w13[0] + 9) = uStack_1e3;
  *(undefined1 *)(w13[0] + 10) = uStack_1f3;
  *(undefined1 *)(w13[0] + 0xb) = uStack_203;
  *(undefined1 *)(w13[0] + 0xc) = uStack_213;
  *(undefined1 *)(w13[0] + 0xd) = uStack_223;
  *(undefined1 *)(w13[0] + 0xe) = uStack_233;
  *(undefined1 *)(w13[0] + 0xf) = uStack_243;
  *(undefined1 *)w13[1] = uStack_156;
  *(undefined1 *)(w13[1] + 1) = uStack_166;
  *(undefined1 *)(w13[1] + 2) = uStack_176;
  *(undefined1 *)(w13[1] + 3) = uStack_186;
  *(undefined1 *)(w13[1] + 4) = uStack_196;
  *(undefined1 *)(w13[1] + 5) = uStack_1a6;
  *(undefined1 *)(w13[1] + 6) = uStack_1b6;
  *(undefined1 *)(w13[1] + 7) = uStack_1c6;
  *(undefined1 *)(w13[1] + 8) = uStack_1d2;
  *(undefined1 *)(w13[1] + 9) = uStack_1e2;
  *(undefined1 *)(w13[1] + 10) = uStack_1f2;
  *(undefined1 *)(w13[1] + 0xb) = uStack_202;
  *(undefined1 *)(w13[1] + 0xc) = uStack_212;
  *(undefined1 *)(w13[1] + 0xd) = uStack_222;
  *(undefined1 *)(w13[1] + 0xe) = uStack_232;
  *(undefined1 *)(w13[1] + 0xf) = uStack_242;
  *(undefined1 *)w12[0] = uStack_155;
  *(undefined1 *)(w12[0] + 1) = uStack_165;
  *(undefined1 *)(w12[0] + 2) = uStack_175;
  *(undefined1 *)(w12[0] + 3) = uStack_185;
  *(undefined1 *)(w12[0] + 4) = uStack_195;
  *(undefined1 *)(w12[0] + 5) = uStack_1a5;
  *(undefined1 *)(w12[0] + 6) = uStack_1b5;
  *(undefined1 *)(w12[0] + 7) = uStack_1c5;
  *(undefined1 *)(w12[0] + 8) = uStack_1d1;
  *(undefined1 *)(w12[0] + 9) = uStack_1e1;
  *(undefined1 *)(w12[0] + 10) = uStack_1f1;
  *(undefined1 *)(w12[0] + 0xb) = uStack_201;
  *(undefined1 *)(w12[0] + 0xc) = uStack_211;
  *(undefined1 *)(w12[0] + 0xd) = uStack_221;
  *(undefined1 *)(w12[0] + 0xe) = uStack_231;
  *(undefined1 *)(w12[0] + 0xf) = uStack_241;
  return;
}

Assistant:

static inline void transpose_pq_14_inv_sse2(__m128i *x0, __m128i *x1,
                                            __m128i *x2, __m128i *x3,
                                            __m128i *x4, __m128i *x5,
                                            __m128i *x6, __m128i *x7,
                                            __m128i *pq0, __m128i *pq1,
                                            __m128i *pq2, __m128i *pq3) {
  __m128i w10, w11, w12, w13;
  __m128i w0, w1, w2, w3, w4, w5;
  __m128i d0, d1, d2, d3;

  w0 = _mm_unpacklo_epi8(
      *x0, *x1);  // p 00 10 01 11 02 12 03 13 04 14 05 15 06 16 07 17
  w1 = _mm_unpacklo_epi8(
      *x2, *x3);  // p 20 30 21 31 22 32 23 33 24 34 25 35 26 36 27 37
  w2 = _mm_unpacklo_epi8(
      *x4, *x5);  // p 40 50 41 51 42 52 43 53 44 54 45 55 46 56 47 57
  w3 = _mm_unpacklo_epi8(
      *x6, *x7);  // p 60 70 61 71 62 72 63 73 64 74 65 75 66 76 67 77

  w4 = _mm_unpacklo_epi16(
      w0, w1);  // 00 10 20 30 01 11 21 31 02 12 22 32 03 13 23 33
  w5 = _mm_unpacklo_epi16(
      w2, w3);  // 40 50 60 70 41 51 61 71 42 52 62 72 43 53 63 73

  d0 = _mm_unpacklo_epi32(
      w4, w5);  // 00 10 20 30 40 50 60 70 01 11 21 31 41 51 61 71
  d2 = _mm_unpackhi_epi32(
      w4, w5);  // 02 12 22 32 42 52 62 72 03 13 23 33 43 53 63 73

  w10 = _mm_unpacklo_epi8(
      *x7, *x6);  // q xx xx xx xx xx xx xx xx 00 10 01 11 02 12 03 13
  w11 = _mm_unpacklo_epi8(
      *x5, *x4);  // q  xx xx xx xx xx xx xx xx 20 30 21 31 22 32 23 33
  w12 = _mm_unpacklo_epi8(
      *x3, *x2);  // q  xx xx xx xx xx xx xx xx 40 50 41 51 42 52 43 53
  w13 = _mm_unpacklo_epi8(
      *x1, *x0);  // q  xx xx xx xx xx xx xx xx 60 70 61 71 62 72 63 73

  w4 = _mm_unpackhi_epi16(
      w10, w11);  // 00 10 20 30 01 11 21 31 02 12 22 32 03 13 23 33
  w5 = _mm_unpackhi_epi16(
      w12, w13);  // 40 50 60 70 41 51 61 71 42 52 62 72 43 53 63 73

  d1 = _mm_unpacklo_epi32(
      w4, w5);  // 00 10 20 30 40 50 60 70 01 11 21 31 41 51 61 71
  d3 = _mm_unpackhi_epi32(
      w4, w5);  // 02 12 22 32 42 52 62 72 03 13 23 33 43 53 63 73

  *pq0 = _mm_unpacklo_epi64(d0, d1);  // pq
  *pq1 = _mm_unpackhi_epi64(d0, d1);  // pq
  *pq2 = _mm_unpacklo_epi64(d2, d3);  // pq
  *pq3 = _mm_unpackhi_epi64(d2, d3);  // pq
}